

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int cm_zlib_deflateGetDictionary(z_streamp strm,Bytef *dictionary,uInt *dictLength)

{
  internal_state *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar3 = deflateStateCheck(strm);
  iVar4 = -2;
  if (iVar3 == 0) {
    piVar1 = strm->state;
    uVar5 = piVar1->lookahead + piVar1->strstart;
    uVar2 = piVar1->w_size;
    if (uVar5 < piVar1->w_size) {
      uVar2 = uVar5;
    }
    if ((dictionary != (Bytef *)0x0) && (uVar2 != 0)) {
      memcpy(dictionary,
             piVar1->window + (((ulong)piVar1->lookahead + (ulong)piVar1->strstart) - (ulong)uVar2),
             (ulong)uVar2);
    }
    iVar4 = 0;
    if (dictLength != (uInt *)0x0) {
      *dictLength = uVar2;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ZEXPORT deflateGetDictionary (strm, dictionary, dictLength)
    z_streamp strm;
    Bytef *dictionary;
    uInt  *dictLength;
{
    deflate_state *s;
    uInt len;

    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;
    len = s->strstart + s->lookahead;
    if (len > s->w_size)
        len = s->w_size;
    if (dictionary != Z_NULL && len)
        zmemcpy(dictionary, s->window + s->strstart + s->lookahead - len, len);
    if (dictLength != Z_NULL)
        *dictLength = len;
    return Z_OK;
}